

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redundancy_elimination.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::RedundancyEliminationPass::EliminateRedundanciesFrom
          (RedundancyEliminationPass *this,DominatorTreeNode *bb,ValueNumberTable *vnTable,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *value_to_ids)

{
  DominatorTreeNode *bb_00;
  bool bVar1;
  reference ppDVar2;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_80;
  DominatorTreeNode *local_50;
  DominatorTreeNode *dominated_bb;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
  *__range2;
  bool modified;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *value_to_ids_local;
  ValueNumberTable *vnTable_local;
  DominatorTreeNode *bb_local;
  RedundancyEliminationPass *this_local;
  
  __range2._7_1_ =
       LocalRedundancyEliminationPass::EliminateRedundanciesInBB
                 (&this->super_LocalRedundancyEliminationPass,bb->bb_,vnTable,value_to_ids);
  __end2 = std::
           vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
           ::begin(&bb->children_);
  dominated_bb = (DominatorTreeNode *)
                 std::
                 vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                 ::end(&bb->children_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                                *)&dominated_bb);
    if (!bVar1) break;
    ppDVar2 = __gnu_cxx::
              __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
              ::operator*(&__end2);
    bb_00 = *ppDVar2;
    local_50 = bb_00;
    std::
    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::map(&local_80,value_to_ids);
    bVar1 = EliminateRedundanciesFrom(this,bb_00,vnTable,&local_80);
    __range2._7_1_ = __range2._7_1_ != false || bVar1;
    std::
    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~map(&local_80);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
    ::operator++(&__end2);
  }
  return __range2._7_1_;
}

Assistant:

bool RedundancyEliminationPass::EliminateRedundanciesFrom(
    DominatorTreeNode* bb, const ValueNumberTable& vnTable,
    std::map<uint32_t, uint32_t> value_to_ids) {
  bool modified = EliminateRedundanciesInBB(bb->bb_, vnTable, &value_to_ids);

  for (auto dominated_bb : bb->children_) {
    modified |= EliminateRedundanciesFrom(dominated_bb, vnTable, value_to_ids);
  }

  return modified;
}